

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.cpp
# Opt level: O1

bool __thiscall cppurses::detail::Timer_event_loop::loop_function(Timer_event_loop *this)

{
  long lVar1;
  undefined1 extraout_AL;
  int iVar2;
  Timer_event_loop *pTVar3;
  long lVar4;
  duration<long,_std::ratio<1L,_1000L>_> dVar5;
  int *piVar6;
  rep rVar7;
  ulong uVar8;
  _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  *this_00;
  Timer_event_loop *pTVar9;
  Timer_event_loop *pTVar10;
  pair<std::_Rb_tree_iterator<cppurses::Widget_*>,_std::_Rb_tree_iterator<cppurses::Widget_*>_>
  pVar11;
  key_type pWStack_38;
  Timer_event_loop *pTStack_30;
  timespec local_28;
  
  pTVar3 = (Timer_event_loop *)
           (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar10 = this;
  while (pTVar9 = pTVar3,
        pTVar9 != (Timer_event_loop *)
                  &(this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header) {
    pTStack_30 = (Timer_event_loop *)0x14f8d2;
    System::post_event<cppurses::Timer_event,cppurses::Widget&>
              (*(Widget **)&(pTVar9->super_Event_loop).return_code_);
    pTStack_30 = (Timer_event_loop *)0x14f8da;
    pTVar3 = (Timer_event_loop *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar9);
    pTVar10 = pTVar9;
  }
  pTStack_30 = (Timer_event_loop *)0x14f8e7;
  lVar4 = std::chrono::_V2::system_clock::now();
  if ((this->period_func_).super__Function_base._M_manager == (_Manager_type)0x0) {
    pTStack_30 = (Timer_event_loop *)
                 std::
                 _Function_handler<void_(cppurses::Widget_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/timer_event_loop.cpp:22:25)>
                 ::_M_invoke;
    std::__throw_bad_function_call();
    this_00 = (_Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
               *)((pTVar10->super_Event_loop)._vptr_Event_loop + 7);
    pTStack_30 = this;
    pVar11 = std::
             _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
             ::equal_range(this_00,&pWStack_38);
    std::
    _Rb_tree<cppurses::Widget_*,_cppurses::Widget_*,_std::_Identity<cppurses::Widget_*>,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
    ::_M_erase_aux(this_00,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
    return (bool)extraout_AL;
  }
  lVar1 = (this->last_time_).__d.__r;
  pTStack_30 = (Timer_event_loop *)0x14f906;
  dVar5 = (*(this->period_func_)._M_invoker)((_Any_data *)&this->period_func_);
  uVar8 = dVar5.__r * 1000000 + (lVar1 - lVar4);
  if (0 < (long)uVar8) {
    local_28.tv_sec = uVar8 / 1000000000;
    local_28.tv_nsec = uVar8 % 1000000000;
    do {
      pTStack_30 = (Timer_event_loop *)0x14f94c;
      iVar2 = nanosleep(&local_28,&local_28);
      if (iVar2 != -1) break;
      pTStack_30 = (Timer_event_loop *)0x14f956;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
  }
  pTStack_30 = (Timer_event_loop *)0x14f960;
  rVar7 = std::chrono::_V2::system_clock::now();
  (this->last_time_).__d.__r = rVar7;
  return (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
}

Assistant:

auto Timer_event_loop::loop_function() -> bool
{
    for (Widget* widg : registered_widgets_) {
        System::post_event<Timer_event>(*widg);
    }
    auto now           = std::chrono::high_resolution_clock::now();
    auto time_passed   = now - last_time_;
    auto time_to_sleep = period_func_() - time_passed;
    if (time_to_sleep > Period_t::zero()) {
        std::this_thread::sleep_for(time_to_sleep);
    }
    last_time_ = std::chrono::high_resolution_clock::now();
    return !registered_widgets_.empty();
}